

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::check_leadership_transfer(raft_server *this)

{
  uint uVar1;
  undefined4 uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  element_type *peVar6;
  element_type *this_00;
  ulong uVar7;
  element_type *peVar8;
  element_type *peVar9;
  uint64_t uVar10;
  long in_RDI;
  uint64_t last_resp_ms;
  int32 cur_priority;
  srv_config *s_conf;
  ptr<peer> peer_elem;
  pair<const_int,_std::shared_ptr<nuraft::peer>_> *entry;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *__range1;
  ulong cur_commit_idx;
  int32 max_priority;
  int32 successor_id;
  unique_lock<std::recursive_mutex> guard;
  size_t hb_interval_ms;
  ptr<raft_params> params;
  int in_stack_00000168;
  bool in_stack_0000016f;
  raft_server *in_stack_00000170;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_fffffffffffffeb8;
  unique_lock<std::recursive_mutex> *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  uint uVar11;
  context *in_stack_fffffffffffffed8;
  timer_helper *in_stack_ffffffffffffff00;
  timer_helper *in_stack_ffffffffffffff08;
  string local_d0 [32];
  ulong local_b0;
  uint local_a4;
  srv_config *local_a0;
  undefined1 local_98 [24];
  undefined1 local_80 [72];
  ulong local_38;
  int local_1c;
  
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x27a1f8);
  nuraft::context::get_params(in_stack_fffffffffffffed8);
  peVar6 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x27a215);
  if (*(int *)(peVar6 + 0x44) == 0) {
    local_1c = 1;
  }
  else {
    bVar3 = timer_helper::timeout(in_stack_ffffffffffffff08);
    if (bVar3) {
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x27a286);
      nuraft::context::get_params(in_stack_fffffffffffffed8);
      peVar6 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x27a2aa);
      iVar5 = *(int *)(peVar6 + 8);
      std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x27a2bd)
      ;
      local_38 = (long)iVar5;
      std::unique_lock<std::recursive_mutex>::unique_lock
                (in_stack_fffffffffffffec0,(mutex_type *)in_stack_fffffffffffffeb8);
      local_80._36_4_ = 0xffffffff;
      local_80._32_4_ = *(uint *)(in_RDI + 0x3c);
      local_80._24_8_ =
           std::__atomic_base::operator_cast_to_unsigned_long
                     ((__atomic_base<unsigned_long> *)
                      CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_80._16_8_ = in_RDI + 0x1e0;
      local_80._8_8_ =
           std::
           unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
           ::begin(in_stack_fffffffffffffeb8);
      local_80._0_8_ =
           std::
           unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
           ::end(in_stack_fffffffffffffeb8);
      while (bVar3 = std::__detail::operator!=
                               ((_Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                 *)(local_80 + 8),
                                (_Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                 *)local_80), bVar3) {
        local_98._16_8_ =
             std::__detail::
             _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
             operator*((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                        *)0x27a37e);
        in_stack_ffffffffffffff00 = (timer_helper *)local_98;
        std::shared_ptr<nuraft::peer>::shared_ptr
                  ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffec0,
                   (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffeb8);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x27a3ae);
        local_a0 = peer::get_config((peer *)0x27a3b6);
        local_a4 = srv_config::get_priority(local_a0);
        if ((int)local_80._32_4_ < (int)local_a4) {
          local_80._32_4_ = local_a4;
          local_80._36_4_ = srv_config::get_id(local_a0);
        }
        this_00 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x27a459);
        uVar7 = peer::get_matched_idx(this_00);
        peVar6 = std::
                 __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x27a475);
        if ((__pthread_internal_list *)(uVar7 + (long)*(int *)(peVar6 + 0x34)) <
            (ulong)local_80._24_8_) {
          local_1c = 1;
        }
        else {
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x27a4a8);
          uVar10 = peer::get_resp_timer_us((peer *)0x27a4b0);
          local_b0 = uVar10 / 1000;
          if (local_38 < local_b0) {
            local_1c = 1;
          }
          else {
            local_1c = 0;
          }
        }
        std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x27a505);
        if (local_1c != 0) goto LAB_0027a6e4;
        std::__detail::
        _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
        operator++((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                    *)in_stack_fffffffffffffec0);
      }
      if ((*(int *)(in_RDI + 0x3c) < (int)local_80._32_4_) && (local_80._36_4_ != 0xffffffff)) {
        peVar8 = std::
                 __shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x27a566);
        bVar4 = (**(code **)(*(long *)peVar8 + 0xa0))();
        if ((bVar4 & 1) == 0) {
          local_1c = 1;
        }
        else {
          bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
          if (bVar3) {
            peVar9 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x27a5d9);
            iVar5 = (**(code **)(*(long *)peVar9 + 0x38))();
            if (3 < iVar5) {
              in_stack_fffffffffffffec0 =
                   (unique_lock<std::recursive_mutex> *)
                   std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x27a609);
              uVar2 = local_80._32_4_;
              uVar1 = *(uint *)(in_RDI + 0x3c);
              uVar11 = local_80._36_4_;
              uVar10 = timer_helper::get_sec(in_stack_ffffffffffffff00);
              msg_if_given_abi_cxx11_
                        ((char *)local_d0,
                         "going to transfer leadership to %d, my priority %d, max priority %d, has been leader for %lu sec"
                         ,(ulong)uVar11,(ulong)uVar1,(ulong)(uint)uVar2,uVar10);
              (**(code **)((long)&in_stack_fffffffffffffec0->_M_device[1].
                                  super___recursive_mutex_base._M_mutex + 0x18))
                        (in_stack_fffffffffffffec0,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                         ,"check_leadership_transfer",0x492,local_d0);
              std::__cxx11::string::~string(local_d0);
            }
          }
          yield_leadership(in_stack_00000170,in_stack_0000016f,in_stack_00000168);
          local_1c = 0;
        }
      }
      else {
        local_1c = 1;
      }
LAB_0027a6e4:
      std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_fffffffffffffec0);
    }
    else {
      local_1c = 1;
    }
  }
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x27a6fe);
  return;
}

Assistant:

void raft_server::check_leadership_transfer() {
    ptr<raft_params> params = ctx_->get_params();
    if (!params->leadership_transfer_min_wait_time_) {
        // Transferring leadership is disabled.
        return;
    }
    if (!leadership_transfer_timer_.timeout()) {
        // Leadership period is too short.
        return;
    }

    size_t hb_interval_ms = ctx_->get_params()->heart_beat_interval_;

    recur_lock(lock_);

    int32 successor_id = -1;
    int32 max_priority = my_priority_;
    ulong cur_commit_idx = quick_commit_index_;
    for (auto& entry: peers_) {
        ptr<peer> peer_elem = entry.second;
        const srv_config& s_conf = peer_elem->get_config();
        int32 cur_priority = s_conf.get_priority();
        if (cur_priority > max_priority) {
            max_priority = cur_priority;
            successor_id = s_conf.get_id();
        }

        if (peer_elem->get_matched_idx() + params->stale_log_gap_ <
                cur_commit_idx) {
            // This peer is lagging behind.
            return;
        }

        uint64_t last_resp_ms = peer_elem->get_resp_timer_us() / 1000;
        if (last_resp_ms > hb_interval_ms) {
            // This replica is not responding.
            return;
        }
    }

    if (my_priority_ >= max_priority || successor_id == -1) {
        // This leader already has the highest priority.
        return;
    }

    if (!state_machine_->allow_leadership_transfer()) {
        // Although all conditions are met,
        // user does not want to transfer the leadership.
        return;
    }

    p_in( "going to transfer leadership to %d, "
          "my priority %d, max priority %d, "
          "has been leader for %" PRIu64 " sec",
          successor_id, my_priority_, max_priority,
          leadership_transfer_timer_.get_sec() );
    yield_leadership(false, successor_id);
}